

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall util_tests::util_TrimString::test_method(util_TrimString *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s2;
  int iVar1;
  void *pvVar2;
  size_type sVar3;
  undefined8 uVar4;
  ulong uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  char *unaff_R12;
  char *this_01;
  char *pcVar8;
  long in_FS_OFFSET;
  bool bVar9;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  lazy_ostream local_170;
  undefined1 *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 local_130 [8];
  shared_count local_128;
  char *local_120;
  char *local_118 [2];
  shared_count sStack_108;
  undefined1 local_100 [8];
  undefined **local_f8;
  undefined1 local_f0;
  undefined1 *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  shared_count *local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  char *local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x138;
  file.m_begin = (iterator)&local_140;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_150,msg);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x9;
  pcVar8 = " foo bar ";
  local_d8._8_8_ = " foo bar ";
  this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  do {
    pvVar2 = memchr(" \f\n\r\t\v",(int)this_00->_M_local_buf[0xf9895e],6);
    if (pvVar2 == (void *)0x0) goto LAB_006f6eda;
    this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)this_00 + 1);
  } while (this_00 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x9);
  this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0xffffffffffffffff;
LAB_006f6eda:
  if (this_00 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0xffffffffffffffff) {
    uVar5 = 0;
    pcVar8 = (char *)0x0;
LAB_006f6f30:
    local_58._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_58 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar8,pcVar8 + uVar5);
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"foo bar");
    local_78[0] = (char *)CONCAT71(local_78[0]._1_7_,iVar1 == 0);
    local_78[1] = (char *)0x0;
    aStack_68._M_allocated_capacity = 0;
    this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98;
    local_98._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_98._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
         + 0x5c;
    local_c0 = (shared_count *)local_b8;
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_c8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_118;
    local_118[0] = "foo bar";
    local_f0 = 0;
    local_f8 = &PTR__lazy_ostream_013d4530;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_58;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_78,&local_170,1,2,REQUIRE,0xf98968,(size_t)this_00,0x138,
               local_d8,"\"foo bar\"",&local_f8);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
    }
    local_180 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_178 = "";
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    local_188 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x139;
    file_00.m_begin = (iterator)&local_180;
    msg_00.m_end = pvVar7;
    msg_00.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190,
               msg_00);
    local_170.m_empty = false;
    local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "";
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x29;
    local_d8._8_8_ = "\t \n  \n \f\n\r\t\v\tfoo \n \f\n\r\t\v\tbar\t  \n \f\n\r\t\v\t\n ";
    pcVar8 = (char *)0x0;
    do {
      pvVar2 = memchr(" \f\n\r\t\v",(int)pcVar8[0xf98992],6);
      if (pvVar2 == (void *)0x0) goto LAB_006f7110;
      pcVar8 = (char *)((long)pcVar8 + 1);
    } while (pcVar8 != (undefined1 *)0x29);
    pcVar8 = (char *)0xffffffffffffffff;
LAB_006f7110:
    this_01 = "";
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xffffffffffffffff) {
      local_98._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_98._8_8_ = (char *)0x0;
    }
    else {
      unaff_R12 = local_d8;
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)unaff_R12," \f\n\r\t\v"
                         ,0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < pcVar8) goto LAB_006f8dcd;
      local_98._0_8_ = (sVar3 - (long)pcVar8) + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_d8._0_8_ - (long)pcVar8) < (ulong)local_98._0_8_) {
        local_98._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_d8._0_8_ - (long)pcVar8);
      }
      local_98._8_8_ = local_d8._8_8_ + (long)pcVar8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xf) {
      iVar1 = bcmp((void *)local_98._8_8_,"foo \n \f\n\r\t\v\tbar",0xf);
      bVar9 = iVar1 == 0;
    }
    else {
      bVar9 = false;
    }
    local_58[0] = bVar9;
    local_58._8_8_ = 0;
    local_58._16_8_ = (sp_counted_base *)0x0;
    local_78[0] = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_78[1] = (char *)((long)
                           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                          + 0x5c);
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = &PTR__lazy_ostream_013d5970;
    local_c8 = boost::unit_test::lazy_ostream::inst;
    local_c0 = (shared_count *)local_b8;
    local_118[0] = "foo \n \f\n\r\t\v\tbar";
    local_f0 = 0;
    local_f8 = &PTR__lazy_ostream_013d5500;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_118;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_b8._0_8_ = this_00;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_58,&local_170,1,2,REQUIRE,0xf989bc,(size_t)local_78,0x139,
               local_d8,"\"foo \\n \\f\\n\\r\\t\\v\\tbar\"",&local_f8);
    unaff_R12 = local_58 + 0x10;
    boost::detail::shared_count::~shared_count((shared_count *)unaff_R12);
    local_1a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_198 = "";
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x13a;
    file_01.m_begin = (iterator)&local_1a0;
    msg_01.m_end = pvVar7;
    msg_01.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1b0,
               msg_01);
    local_170.m_empty = false;
    local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "";
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x11;
    local_d8._8_8_ = "\t \n foo \n\tbar\t \n ";
    this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    do {
      pvVar2 = memchr(" \f\n\r\t\v",(int)this_00->_M_local_buf[0xf98a3a],6);
      if (pvVar2 == (void *)0x0) goto LAB_006f734a;
      this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)this_00 + 1);
    } while (this_00 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x11);
    this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xffffffffffffffff;
LAB_006f734a:
    if (this_00 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xffffffffffffffff) {
      uVar5 = 0;
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = local_d8;
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)pcVar8," \f\n\r\t\v",
                         0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < this_00) goto LAB_006f8dfc;
      uVar5 = (sVar3 - (long)this_00) + 1;
      if ((ulong)(local_d8._0_8_ - (long)this_00) < uVar5) {
        uVar5 = local_d8._0_8_ - (long)this_00;
      }
      pcVar8 = this_00->_M_local_buf + local_d8._8_8_;
    }
    local_58._0_8_ = unaff_R12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar8,pcVar8 + uVar5);
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"foo \n\tbar");
    local_78[0] = (char *)CONCAT71(local_78[0]._1_7_,iVar1 == 0);
    local_78[1] = (char *)0x0;
    aStack_68._M_allocated_capacity = 0;
    this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98;
    local_98._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_98._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
         + 0x5c;
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_c8 = boost::unit_test::lazy_ostream::inst;
    local_c0 = (shared_count *)local_b8;
    local_118[0] = "foo \n\tbar";
    local_f0 = 0;
    local_f8 = &PTR__lazy_ostream_013d44f0;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_118;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_58;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_78,&local_170,1,2,REQUIRE,0xf98a4c,(size_t)this_00,0x13a,
               local_d8,"\"foo \\n\\tbar\"",&local_f8);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
    if ((char *)local_58._0_8_ != unaff_R12) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
    }
    local_1c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    this_01 = "";
    local_1b8 = "";
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x13b;
    file_02.m_begin = (iterator)&local_1c0;
    msg_02.m_end = pvVar7;
    msg_02.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d0,
               msg_02);
    local_170.m_empty = false;
    local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "";
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x11;
    local_d8._8_8_ = "\t \n foo \n\tbar\t \n ";
    pcVar8 = (char *)0x0;
    do {
      pvVar2 = memchr("fobar",(int)pcVar8[0xf98a3a],5);
      if (pvVar2 == (void *)0x0) goto LAB_006f75a8;
      pcVar8 = (char *)((long)pcVar8 + 1);
    } while (pcVar8 != (undefined1 *)0x11);
    pcVar8 = (char *)0xffffffffffffffff;
LAB_006f75a8:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xffffffffffffffff) {
      local_98._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_98._8_8_ = (char *)0x0;
    }
    else {
      unaff_R12 = local_d8;
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)unaff_R12,"fobar",
                         0xffffffffffffffff,5);
      if ((ulong)local_d8._0_8_ < pcVar8) goto LAB_006f8e2b;
      local_98._0_8_ = (sVar3 - (long)pcVar8) + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_d8._0_8_ - (long)pcVar8) < (ulong)local_98._0_8_) {
        local_98._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_d8._0_8_ - (long)pcVar8);
      }
      local_98._8_8_ = local_d8._8_8_ + (long)pcVar8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x11) {
      iVar1 = bcmp((void *)local_98._8_8_,"\t \n foo \n\tbar\t \n ",0x11);
      bVar9 = iVar1 == 0;
    }
    else {
      bVar9 = false;
    }
    local_58[0] = bVar9;
    local_58._8_8_ = 0;
    local_58._16_8_ = (sp_counted_base *)0x0;
    unaff_R12 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_78[0] = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_78[1] = (char *)((long)
                           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                          + 0x5c);
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = &PTR__lazy_ostream_013d5970;
    local_c8 = boost::unit_test::lazy_ostream::inst;
    local_c0 = (shared_count *)local_b8;
    local_118[0] = "\t \n foo \n\tbar\t \n ";
    local_f0 = 0;
    local_f8 = &PTR__lazy_ostream_013d54c0;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_118;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_b8._0_8_ = this_00;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_58,&local_170,1,2,REQUIRE,0xf98a90,(size_t)local_78,0x13b,
               local_d8,"\"\\t \\n foo \\n\\tbar\\t \\n \"",&local_f8);
    this_01 = local_58 + 0x10;
    boost::detail::shared_count::~shared_count((shared_count *)this_01);
    local_1e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_1d8 = "";
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x13c;
    file_03.m_begin = (iterator)&local_1e0;
    msg_03.m_end = pvVar7;
    msg_03.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f0,
               msg_03);
    local_170.m_empty = false;
    local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "";
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x7;
    local_d8._8_8_ = "foo bar";
    this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    do {
      pvVar2 = memchr(" \f\n\r\t\v",(int)this_00[0xf9898]._M_local_buf[0],6);
      if (pvVar2 == (void *)0x0) goto LAB_006f77da;
      this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)this_00 + 1);
    } while (this_00 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x7);
    this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xffffffffffffffff;
LAB_006f77da:
    if (this_00 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xffffffffffffffff) {
      uVar5 = 0;
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = local_d8;
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)pcVar8," \f\n\r\t\v",
                         0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < this_00) goto LAB_006f8e5a;
      uVar5 = (sVar3 - (long)this_00) + 1;
      if ((ulong)(local_d8._0_8_ - (long)this_00) < uVar5) {
        uVar5 = local_d8._0_8_ - (long)this_00;
      }
      pcVar8 = this_00->_M_local_buf + local_d8._8_8_;
    }
    local_58._0_8_ = this_01;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar8,pcVar8 + uVar5);
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,"foo bar");
    local_78[0] = (char *)CONCAT71(local_78[0]._1_7_,iVar1 == 0);
    local_78[1] = (char *)0x0;
    aStack_68._M_allocated_capacity = 0;
    unaff_R12 = local_98;
    local_98._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_98._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
         + 0x5c;
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_c8 = boost::unit_test::lazy_ostream::inst;
    local_c0 = (shared_count *)local_b8;
    local_118[0] = "foo bar";
    local_f0 = 0;
    local_f8 = &PTR__lazy_ostream_013d4530;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_118;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_58;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_78,&local_170,1,2,REQUIRE,0xf98add,(size_t)unaff_R12,0x13c,
               local_d8,"\"foo bar\"",&local_f8);
    this_00 = &aStack_68;
    boost::detail::shared_count::~shared_count((shared_count *)&this_00->_M_allocated_capacity);
    if ((char *)local_58._0_8_ != this_01) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
    }
    local_200 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_1f8 = "";
    local_210 = &boost::unit_test::basic_cstring<char_const>::null;
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x13d;
    file_04.m_begin = (iterator)&local_200;
    msg_04.m_end = pvVar7;
    msg_04.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_210,
               msg_04);
    local_170.m_empty = false;
    local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "";
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x7;
    local_d8._8_8_ = "foo bar";
    pcVar8 = (char *)0x0;
    do {
      pvVar2 = memchr("fobar",(int)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)((long)pcVar8 + 0xf98980))->_M_local_buf[0],5);
      if (pvVar2 == (void *)0x0) goto LAB_006f7a25;
      pcVar8 = (char *)((long)pcVar8 + 1);
    } while (pcVar8 != (undefined1 *)0x7);
    pcVar8 = (char *)0xffffffffffffffff;
LAB_006f7a25:
    this_01 = "";
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xffffffffffffffff) {
      local_98._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_98._8_8_ = (char *)0x0;
    }
    else {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_d8,"fobar",
                         0xffffffffffffffff,5);
      if ((ulong)local_d8._0_8_ < pcVar8) goto LAB_006f8e89;
      local_98._0_8_ = (sVar3 - (long)pcVar8) + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_d8._0_8_ - (long)pcVar8) < (ulong)local_98._0_8_) {
        local_98._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_d8._0_8_ - (long)pcVar8);
      }
      local_98._8_8_ = local_d8._8_8_ + (long)pcVar8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x1) {
      iVar1 = bcmp((void *)local_98._8_8_," ",1);
      bVar9 = iVar1 == 0;
    }
    else {
      bVar9 = false;
    }
    local_58[0] = bVar9;
    local_58._8_8_ = 0;
    local_58._16_8_ = (sp_counted_base *)0x0;
    local_78[0] = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_78[1] = (char *)((long)
                           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                          + 0x5c);
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = &PTR__lazy_ostream_013d5970;
    local_c8 = boost::unit_test::lazy_ostream::inst;
    local_c0 = (shared_count *)local_b8;
    local_118[0] = " ";
    local_f0 = 0;
    local_f8 = &PTR__lazy_ostream_013d4430;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_118;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_b8._0_8_ = unaff_R12;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_58,&local_170,1,2,REQUIRE,0xf98af3,(size_t)local_78,0x13d,
               local_d8,"\" \"",&local_f8);
    boost::detail::shared_count::~shared_count((shared_count *)(local_58 + 0x10));
    local_220 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_218 = "";
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x13e;
    file_05.m_begin = (iterator)&local_220;
    msg_05.m_end = pvVar7;
    msg_05.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_230,
               msg_05);
    pcVar8 = (char *)0x0;
    local_170.m_empty = false;
    local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "";
    aStack_68._M_allocated_capacity = 0x2000206f6f662000;
    local_78[1] = &DAT_00000008;
    aStack_68._M_local_buf[8] = '\0';
    local_d8._0_8_ = &DAT_00000008;
    local_d8._8_8_ = this_00;
    local_78[0] = (char *)this_00;
    do {
      pvVar2 = memchr(" \f\n\r\t\v",(int)aStack_68._M_local_buf[(long)pcVar8],6);
      if (pvVar2 == (void *)0x0) goto LAB_006f7c85;
      pcVar8 = (char *)((long)pcVar8 + 1);
    } while (pcVar8 != &DAT_00000008);
    pcVar8 = (char *)0xffffffffffffffff;
LAB_006f7c85:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xffffffffffffffff) {
      uVar5 = 0;
      pcVar8 = (char *)0x0;
    }
    else {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_d8," \f\n\r\t\v",
                         0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < pcVar8) goto LAB_006f8eb8;
      uVar5 = (sVar3 - (long)pcVar8) + 1;
      if ((ulong)(local_d8._0_8_ - (long)pcVar8) < uVar5) {
        uVar5 = local_d8._0_8_ - (long)pcVar8;
      }
      pcVar8 = pcVar8 + local_d8._8_8_;
    }
    local_58._0_8_ = local_58 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar8,pcVar8 + uVar5);
    __s2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_98 + 0x10);
    local_98._8_8_ = (char *)0x7;
    local_98._16_8_ = (sp_counted_base *)0x206f6f662000;
    local_98._0_8_ = __s2;
    if (local_58._8_8_ == 7) {
      iVar1 = bcmp((void *)local_58._0_8_,__s2,7);
      bVar9 = iVar1 == 0;
    }
    else {
      bVar9 = false;
    }
    local_b8[0] = bVar9;
    local_b8._8_8_ = (element_type *)0x0;
    local_b8._16_8_ = (sp_counted_base *)0x0;
    pcVar8 = (char *)local_118;
    local_118[0] = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_118[1] = "";
    local_c0 = &local_128;
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_c8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_100;
    local_f0 = 0;
    local_f8 = &PTR__lazy_ostream_013d3d70;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_128.pi_ = (sp_counted_base *)local_58;
    local_100 = (undefined1  [8])unaff_R12;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_b8,&local_170,1,2,REQUIRE,0xf98b16,(size_t)pcVar8,0x13e,
               local_d8,"std::string(\"\\0 foo \\0\", 7)",&local_f8);
    boost::detail::shared_count::~shared_count((shared_count *)(local_b8 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ != __s2) {
      operator_delete((void *)local_98._0_8_,(ulong)((long)(_func_int ***)local_98._16_8_ + 1));
    }
    this_01 = "";
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78[0] != this_00) {
      operator_delete(local_78[0],(ulong)(aStack_68._M_allocated_capacity + 1));
    }
    local_240 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_238 = "";
    local_250 = &boost::unit_test::basic_cstring<char_const>::null;
    local_248 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x13f;
    file_06.m_begin = (iterator)&local_240;
    msg_06.m_end = pvVar7;
    msg_06.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_250,
               msg_06);
    local_170.m_empty = false;
    local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "";
    local_d8._8_8_ = local_58 + 0x10;
    local_58._16_6_ = 0x206f6f6620;
    local_58._8_8_ = 5;
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x5;
    unaff_R12 = (char *)0x0;
    local_58._0_8_ = local_d8._8_8_;
    do {
      pvVar2 = memchr(" \f\n\r\t\v",(int)unaff_R12[(long)(local_58 + 0x10)],6);
      if (pvVar2 == (void *)0x0) goto LAB_006f7f92;
      unaff_R12 = (char *)((long)unaff_R12 + 1);
    } while (unaff_R12 != (undefined1 *)0x5);
    unaff_R12 = (char *)0xffffffffffffffff;
LAB_006f7f92:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)unaff_R12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xffffffffffffffff) {
      local_118[0] = (char *)0x0;
      local_118[1] = (char *)0x0;
    }
    else {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_d8," \f\n\r\t\v",
                         0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < unaff_R12) goto LAB_006f8ee7;
      local_118[0] = (char *)((sVar3 - (long)unaff_R12) + 1);
      if ((char *)(local_d8._0_8_ - (long)unaff_R12) < local_118[0]) {
        local_118[0] = (char *)(local_d8._0_8_ - (long)unaff_R12);
      }
      local_118[1] = (char *)(local_d8._8_8_ + (long)unaff_R12);
    }
    aStack_68._M_allocated_capacity._0_4_ = 0x6f6f66;
    local_78[1] = (char *)0x3;
    if (local_118[0] == (char *)0x3) {
      local_78[0] = (char *)this_00;
      iVar1 = bcmp(local_118[1],this_00,3);
      bVar9 = iVar1 == 0;
    }
    else {
      bVar9 = false;
      local_78[0] = (char *)this_00;
    }
    unaff_R12 = local_98;
    local_98[0] = bVar9;
    local_98._8_8_ = (char *)0x0;
    local_98._16_8_ = (sp_counted_base *)0x0;
    local_b8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_b8._8_8_ = "";
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = &PTR__lazy_ostream_013d5970;
    local_c8 = boost::unit_test::lazy_ostream::inst;
    local_c0 = &local_128;
    local_100 = (undefined1  [8])local_78;
    local_f0 = 0;
    local_f8 = &PTR__lazy_ostream_013d3d70;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_100;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_128.pi_ = (sp_counted_base *)pcVar8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)unaff_R12,&local_170,1,2,REQUIRE,0xf98b61,(size_t)local_b8,0x13f,
               local_d8,"std::string(\"foo\", 3)",&local_f8);
    this_01 = local_98 + 0x10;
    boost::detail::shared_count::~shared_count((shared_count *)this_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78[0] != this_00) {
      operator_delete(local_78[0],(ulong)(aStack_68._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
    }
    local_260 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_258 = "";
    local_270 = &boost::unit_test::basic_cstring<char_const>::null;
    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x140;
    file_07.m_begin = (iterator)&local_260;
    msg_07.m_end = pvVar7;
    msg_07.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_270,
               msg_07);
    pcVar8 = (char *)0x0;
    local_170.m_empty = false;
    local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "";
    local_78[1] = (char *)0x6;
    aStack_68._M_allocated_capacity._0_7_ = 0xa0a00000909;
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x6;
    local_d8._8_8_ = this_00;
    local_78[0] = (char *)this_00;
    do {
      pvVar2 = memchr(" \f\n\r\t\v",(int)aStack_68._M_local_buf[(long)pcVar8],6);
      if (pvVar2 == (void *)0x0) goto LAB_006f825e;
      pcVar8 = (char *)((long)pcVar8 + 1);
    } while (pcVar8 != (undefined1 *)0x6);
    pcVar8 = (char *)0xffffffffffffffff;
LAB_006f825e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xffffffffffffffff) {
      uVar5 = 0;
      pcVar8 = (char *)0x0;
    }
    else {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_d8," \f\n\r\t\v",
                         0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < pcVar8) goto LAB_006f8f16;
      uVar5 = (sVar3 - (long)pcVar8) + 1;
      if ((ulong)(local_d8._0_8_ - (long)pcVar8) < uVar5) {
        uVar5 = local_d8._0_8_ - (long)pcVar8;
      }
      pcVar8 = pcVar8 + local_d8._8_8_;
    }
    local_58._0_8_ = local_58 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar8,pcVar8 + uVar5);
    local_98._8_8_ = (char *)0x2;
    local_98._16_8_ = local_98._16_8_ & 0xffffffffff000000;
    local_98._0_8_ = this_01;
    if (local_58._8_8_ == 2) {
      iVar1 = bcmp((void *)local_58._0_8_,this_01,2);
      bVar9 = iVar1 == 0;
    }
    else {
      bVar9 = false;
    }
    local_b8[0] = bVar9;
    local_b8._8_8_ = (element_type *)0x0;
    local_b8._16_8_ = (sp_counted_base *)0x0;
    pcVar8 = (char *)local_118;
    local_118[0] = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_118[1] = "";
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_c8 = boost::unit_test::lazy_ostream::inst;
    local_c0 = &local_128;
    local_f0 = 0;
    local_f8 = &PTR__lazy_ostream_013d3d70;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_100;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_128.pi_ = (sp_counted_base *)local_58;
    local_100 = (undefined1  [8])unaff_R12;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_b8,&local_170,1,2,REQUIRE,0xf98b9f,(size_t)pcVar8,0x140,
               local_d8,"std::string(\"\\0\\0\", 2)",&local_f8);
    boost::detail::shared_count::~shared_count((shared_count *)(local_b8 + 0x10));
    if ((char *)local_98._0_8_ != this_01) {
      operator_delete((void *)local_98._0_8_,(ulong)((long)(_func_int ***)local_98._16_8_ + 1));
    }
    this_01 = "";
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78[0] != this_00) {
      operator_delete(local_78[0],(ulong)(aStack_68._M_allocated_capacity + 1));
    }
    local_280 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_278 = "";
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    local_288 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x141;
    file_08.m_begin = (iterator)&local_280;
    msg_08.m_end = pvVar7;
    msg_08.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_290,
               msg_08);
    unaff_R12 = (char *)0x0;
    local_170.m_empty = false;
    local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "";
    local_d8._8_8_ = local_58 + 0x10;
    local_58._8_8_ = 6;
    local_58._16_7_ = 0x102030405;
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x6;
    local_58._0_8_ = local_d8._8_8_;
    do {
      pvVar2 = memchr(" \f\n\r\t\v",(int)unaff_R12[(long)(local_58 + 0x10)],6);
      if (pvVar2 == (void *)0x0) goto LAB_006f8574;
      unaff_R12 = (char *)((long)unaff_R12 + 1);
    } while (unaff_R12 != (undefined1 *)0x6);
    unaff_R12 = (char *)0xffffffffffffffff;
LAB_006f8574:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)unaff_R12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xffffffffffffffff) {
      local_118[0] = (char *)0x0;
      local_118[1] = (char *)0x0;
    }
    else {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_d8," \f\n\r\t\v",
                         0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < unaff_R12) goto LAB_006f8f45;
      local_118[0] = (char *)((sVar3 - (long)unaff_R12) + 1);
      if ((char *)(local_d8._0_8_ - (long)unaff_R12) < local_118[0]) {
        local_118[0] = (char *)(local_d8._0_8_ - (long)unaff_R12);
      }
      local_118[1] = (char *)(local_d8._8_8_ + (long)unaff_R12);
    }
    local_78[1] = (char *)0x6;
    aStack_68._M_allocated_capacity._0_7_ = 0x102030405;
    if (local_118[0] == (char *)0x6) {
      local_78[0] = (char *)this_00;
      iVar1 = bcmp(local_118[1],this_00,6);
      bVar9 = iVar1 == 0;
    }
    else {
      bVar9 = false;
      local_78[0] = (char *)this_00;
    }
    local_98[0] = bVar9;
    local_98._8_8_ = 0;
    local_98._16_8_ = (sp_counted_base *)0x0;
    local_b8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_b8._8_8_ = "";
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = &PTR__lazy_ostream_013d5970;
    local_c8 = boost::unit_test::lazy_ostream::inst;
    local_c0 = &local_128;
    local_100 = (undefined1  [8])local_78;
    local_f0 = 0;
    local_f8 = &PTR__lazy_ostream_013d3d70;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_100;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_128.pi_ = (sp_counted_base *)pcVar8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_98,&local_170,1,2,REQUIRE,0xf98be1,(size_t)local_b8,0x141,
               local_d8,"std::string(\"\\x05\\x04\\x03\\x02\\x01\\x00\", 6)",&local_f8);
    this_01 = local_98 + 0x10;
    boost::detail::shared_count::~shared_count((shared_count *)this_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78[0] != this_00) {
      operator_delete(local_78[0],(ulong)(aStack_68._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
    }
    local_2a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_298 = "";
    local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x142;
    file_09.m_begin = (iterator)&local_2a0;
    msg_09.m_end = pvVar7;
    msg_09.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2b0,
               msg_09);
    pcVar8 = (char *)0x0;
    local_170.m_empty = false;
    local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "";
    local_78[1] = (char *)0x6;
    aStack_68._M_allocated_capacity._0_7_ = 0x102030405;
    local_98._16_6_ = 0x102030405;
    local_98._8_8_ = (char *)0x5;
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x6;
    local_d8._8_8_ = this_00;
    local_98._0_8_ = this_01;
    local_78[0] = (char *)this_00;
    do {
      pvVar2 = memchr(this_01,(int)aStack_68._M_local_buf[(long)pcVar8],5);
      if (pvVar2 == (void *)0x0) goto LAB_006f887c;
      pcVar8 = (char *)((long)pcVar8 + 1);
    } while (pcVar8 != (undefined1 *)0x6);
    pcVar8 = (char *)0xffffffffffffffff;
LAB_006f887c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xffffffffffffffff) {
      uVar5 = 0;
      pcVar8 = (char *)0x0;
    }
    else {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_d8,this_01,
                         0xffffffffffffffff,5);
      if ((ulong)local_d8._0_8_ < pcVar8) goto LAB_006f8f74;
      uVar5 = (sVar3 - (long)pcVar8) + 1;
      if ((ulong)(local_d8._0_8_ - (long)pcVar8) < uVar5) {
        uVar5 = local_d8._0_8_ - (long)pcVar8;
      }
      pcVar8 = pcVar8 + local_d8._8_8_;
    }
    local_58._0_8_ = local_58 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar8,pcVar8 + uVar5);
    local_b8._0_8_ = local_b8 + 0x10;
    local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffff0000;
    local_b8._8_8_ = (element_type *)0x1;
    if (local_58._8_8_ == 1) {
      iVar1 = bcmp((void *)local_58._0_8_,(void *)local_b8._0_8_,1);
      bVar9 = iVar1 == 0;
    }
    else {
      bVar9 = false;
    }
    local_118[0] = (char *)CONCAT71(local_118[0]._1_7_,bVar9);
    local_118[1] = (char *)0x0;
    sStack_108.pi_ = (sp_counted_base *)0x0;
    local_128.pi_ = (sp_counted_base *)0xf98108;
    local_120 = "";
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = &PTR__lazy_ostream_013d3d70;
    local_c8 = boost::unit_test::lazy_ostream::inst;
    local_c0 = (shared_count *)local_100;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_130;
    local_f0 = 0;
    local_f8 = &PTR__lazy_ostream_013d3d70;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_130 = (undefined1  [8])local_b8;
    local_100 = (undefined1  [8])local_58;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_118,&local_170,1,2,REQUIRE,0xf98c4d,(size_t)&local_128,
               0x142,local_d8,"std::string(\"\\0\", 1)",&local_f8);
    boost::detail::shared_count::~shared_count(&sStack_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,(ulong)((long)(_func_int ***)local_b8._16_8_ + 1));
    }
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
    }
    if ((char *)local_98._0_8_ != this_01) {
      operator_delete((void *)local_98._0_8_,(ulong)((long)(_func_int ***)local_98._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78[0] != this_00) {
      operator_delete(local_78[0],(ulong)(aStack_68._M_allocated_capacity + 1));
    }
    local_2c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_2b8 = "";
    local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x143;
    file_10.m_begin = (iterator)&local_2c0;
    msg_10.m_end = pvVar7;
    msg_10.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2d0,
               msg_10);
    this_01 = (char *)0x0;
    local_170.m_empty = false;
    local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "";
    local_d8._8_8_ = local_58 + 0x10;
    local_58._8_8_ = 6;
    local_58._16_7_ = 0x102030405;
    local_78[1] = (char *)0x6;
    aStack_68._M_allocated_capacity._0_7_ = 0x102030405;
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x6;
    local_78[0] = (char *)this_00;
    local_58._0_8_ = local_d8._8_8_;
    do {
      pvVar2 = memchr(this_00,(int)this_01[(long)(local_58 + 0x10)],6);
      if (pvVar2 == (void *)0x0) goto LAB_006f8bd4;
      this_01 = (char *)((long)this_01 + 1);
    } while (this_01 != (undefined1 *)0x6);
    this_01 = (char *)0xffffffffffffffff;
LAB_006f8bd4:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)this_01 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xffffffffffffffff) {
      local_118[0] = (char *)0x0;
      local_118[1] = (char *)0x0;
    }
    else {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_d8,
                         this_00->_M_local_buf,0xffffffffffffffff,6);
      if ((ulong)local_d8._0_8_ < this_01) goto LAB_006f8fa3;
      local_118[0] = (char *)((sVar3 - (long)this_01) + 1);
      if ((char *)(local_d8._0_8_ - (long)this_01) < local_118[0]) {
        local_118[0] = (char *)(local_d8._0_8_ - (long)this_01);
      }
      local_118[1] = (char *)(local_d8._8_8_ + (long)this_01);
    }
    local_98[0] = local_118[0] == (char *)0x0;
    local_98._8_8_ = (char *)0x0;
    local_98._16_8_ = (sp_counted_base *)0x0;
    local_b8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_b8._8_8_ = "";
    local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
    local_d8._0_8_ = &PTR__lazy_ostream_013d5970;
    local_c8 = boost::unit_test::lazy_ostream::inst;
    local_100 = (undefined1  [8])0xf98c4c;
    local_f0 = 0;
    local_f8 = &PTR__lazy_ostream_013d42f0;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_100;
    local_128.pi_ = (sp_counted_base *)local_118;
    local_c0 = &local_128;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_98,&local_170,1,2,REQUIRE,0xf98cc1,(size_t)local_b8,0x143,
               local_d8,"\"\"",&local_f8);
    boost::detail::shared_count::~shared_count((shared_count *)(local_98 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78[0] != this_00) {
      operator_delete(local_78[0],(ulong)(aStack_68._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_d8," \f\n\r\t\v",
                       0xffffffffffffffff,6);
    if (this_00 <= (ulong)local_d8._0_8_) {
      uVar5 = (sVar3 - (long)this_00) + 1;
      if ((ulong)(local_d8._0_8_ - (long)this_00) < uVar5) {
        uVar5 = local_d8._0_8_ - (long)this_00;
      }
      pcVar8 = this_00->_M_local_buf + local_d8._8_8_;
      goto LAB_006f6f30;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006f9226;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
               this_00);
LAB_006f8dcd:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006f9226;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pcVar8
              );
LAB_006f8dfc:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006f9226;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
               this_00);
LAB_006f8e2b:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006f9226;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pcVar8
              );
LAB_006f8e5a:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006f9226;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
               this_00);
LAB_006f8e89:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006f9226;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pcVar8
              );
LAB_006f8eb8:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006f9226;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pcVar8
              );
LAB_006f8ee7:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006f9226;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
               unaff_R12);
LAB_006f8f16:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006f9226;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pcVar8
              );
LAB_006f8f45:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006f9226;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
               unaff_R12);
LAB_006f8f74:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006f9226;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pcVar8
              );
LAB_006f8fa3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",this_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78[0] != this_00) {
        operator_delete(local_78[0],(ulong)(aStack_68._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_58 + 0x10)) {
        operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(uVar4);
      }
    }
  }
LAB_006f9226:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_TrimString)
{
    BOOST_CHECK_EQUAL(TrimString(" foo bar "), "foo bar");
    BOOST_CHECK_EQUAL(TrimStringView("\t \n  \n \f\n\r\t\v\tfoo \n \f\n\r\t\v\tbar\t  \n \f\n\r\t\v\t\n "), "foo \n \f\n\r\t\v\tbar");
    BOOST_CHECK_EQUAL(TrimString("\t \n foo \n\tbar\t \n "), "foo \n\tbar");
    BOOST_CHECK_EQUAL(TrimStringView("\t \n foo \n\tbar\t \n ", "fobar"), "\t \n foo \n\tbar\t \n ");
    BOOST_CHECK_EQUAL(TrimString("foo bar"), "foo bar");
    BOOST_CHECK_EQUAL(TrimStringView("foo bar", "fobar"), " ");
    BOOST_CHECK_EQUAL(TrimString(std::string("\0 foo \0 ", 8)), std::string("\0 foo \0", 7));
    BOOST_CHECK_EQUAL(TrimStringView(std::string(" foo ", 5)), std::string("foo", 3));
    BOOST_CHECK_EQUAL(TrimString(std::string("\t\t\0\0\n\n", 6)), std::string("\0\0", 2));
    BOOST_CHECK_EQUAL(TrimStringView(std::string("\x05\x04\x03\x02\x01\x00", 6)), std::string("\x05\x04\x03\x02\x01\x00", 6));
    BOOST_CHECK_EQUAL(TrimString(std::string("\x05\x04\x03\x02\x01\x00", 6), std::string("\x05\x04\x03\x02\x01", 5)), std::string("\0", 1));
    BOOST_CHECK_EQUAL(TrimStringView(std::string("\x05\x04\x03\x02\x01\x00", 6), std::string("\x05\x04\x03\x02\x01\x00", 6)), "");
}